

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

int glslang::TIntermediate::getOffset(TType *type,int index)

{
  TTypeList *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  int offset;
  int memberSize;
  int local_38 [2];
  
  iVar2 = (*type->_vptr_TType[0x25])();
  if ((char)iVar2 != '\0') {
    pTVar1 = (type->field_13).structure;
    iVar2 = (*((pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[index].type)->_vptr_TType[10])();
    if (*(int *)(CONCAT44(extraout_var,iVar2) + 0x14) == -1) {
      local_38[0] = 0;
      local_38[1] = 0;
      if (-1 < index) {
        uVar3 = 0;
        do {
          updateOffset(type,(pTVar1->
                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ).
                            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3].type,local_38,
                       local_38 + 1);
          if (uVar3 < (uint)index) {
            local_38[0] = local_38[0] + local_38[1];
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != index + 1);
      }
    }
    else {
      iVar2 = (*((pTVar1->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[index].type)->_vptr_TType[10])();
      local_38[0] = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x14);
    }
    return local_38[0];
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

int TIntermediate::getOffset(const TType& type, int index)
{
    const TTypeList& memberList = *type.getStruct();

    // Don't calculate offset if one is present, it could be user supplied
    // and different than what would be calculated.  That is, this is faster,
    // but not just an optimization.
    if (memberList[index].type->getQualifier().hasOffset())
        return memberList[index].type->getQualifier().layoutOffset;

    int memberSize = 0;
    int offset = 0;
    for (int m = 0; m <= index; ++m) {
        updateOffset(type, *memberList[m].type, offset, memberSize);

        if (m < index)
            offset += memberSize;
    }

    return offset;
}